

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O3

void __thiscall script_p2sh_tests::norecurse::test_method(norecurse *this)

{
  void *pvVar1;
  shared_count sVar2;
  bool bVar3;
  CScript *this_00;
  uint uVar4;
  const_iterator cVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  undefined8 __first;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  ScriptError err;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sSerialized;
  check_type cVar9;
  char *local_228;
  char *local_220;
  assertion_result local_218;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  ScriptError local_14c;
  string local_148;
  assertion_result local_128;
  string *local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f8;
  undefined1 local_e8 [28];
  uint uStack_cc;
  undefined1 local_c8 [72];
  __index_type local_80;
  direct_or_indirect local_78;
  uint local_5c;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = 0;
  stack0xffffffffffffffc0 = 0;
  local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_58._8_8_ = 0;
  local_c8[0] = 0xff;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
             local_c8);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
  uVar4 = uStack_3c - 0x1d;
  if (uStack_3c < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
    uVar4 = uStack_3c;
  }
  local_c8[0] = 0xff;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar4),local_c8);
  ScriptHash::ScriptHash((ScriptHash *)local_e8,(CScript *)local_58);
  local_c8._16_4_ = local_e8._16_4_;
  local_c8._0_8_ = local_e8._0_8_;
  local_c8._8_8_ = local_e8._8_8_;
  local_80 = '\x03';
  GetScriptForDestination((CScript *)&local_78.indirect_contents,(CTxDestination *)local_c8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_c8);
  local_e8._16_8_ = 0;
  stack0xffffffffffffff30 = 0;
  local_e8._0_8_ = (char *)0x0;
  local_e8[8] = '\0';
  local_e8[9] = '\0';
  local_e8[10] = '\0';
  local_e8[0xb] = '\0';
  local_e8[0xc] = '\0';
  local_e8[0xd] = '\0';
  local_e8[0xe] = '\0';
  local_e8[0xf] = '\0';
  cVar5.ptr = (uchar *)local_58;
  uVar4 = uStack_3c;
  if (0x1c < uStack_3c) {
    cVar5.ptr = (uchar *)local_58._0_8_;
    uVar4 = uStack_3c - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_c8,cVar5,
             (const_iterator)(cVar5.ptr + (int)uVar4),(allocator_type *)local_108);
  CScript::operator<<((CScript *)local_e8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8);
  if ((void *)local_c8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x93;
  file.m_begin = (iterator)&local_160;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_170,msg);
  bVar3 = Verify((CScript *)local_e8,(CScript *)&local_78.indirect_contents,true,&local_14c);
  local_108[0] = !bVar3;
  local_108._8_8_ = (element_type *)0x0;
  aStack_f8._M_allocated_capacity = 0;
  local_c8._24_8_ = &local_128;
  local_128._0_8_ = "!Verify(scriptSig, p2sh, true, err)";
  local_128.m_message.px = (element_type *)0xecc2ae;
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  local_c8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_178 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_c8,1,0,WARN,_cVar9,
             (size_t)&local_180,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)(local_108 + 0x10));
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x94;
  file_00.m_begin = (iterator)&local_190;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
             msg_00);
  local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_14c == SCRIPT_ERR_BAD_OPCODE);
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_((string *)local_108,local_14c);
  local_c8._8_8_ = local_c8._8_8_ & 0xffffffffffffff00;
  local_c8._0_8_ = &PTR__lazy_ostream_013adf88;
  local_c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1a8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x1;
  local_c8._24_8_ = (string *)local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_128,(lazy_ostream *)local_c8,1,1,WARN,_cVar9,(size_t)&local_1b0,0x94);
  if ((shared_count *)CONCAT71(local_108._1_7_,local_108[0]) != (shared_count *)(local_108 + 0x10))
  {
    operator_delete((shared_count *)CONCAT71(local_108._1_7_,local_108[0]),
                    (ulong)(aStack_f8._M_allocated_capacity + 1));
  }
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  ScriptHash::ScriptHash((ScriptHash *)&local_128,(CScript *)&local_78.indirect_contents);
  sVar2.pi_ = local_128.m_message.pn.pi_;
  local_c8[0x10] = (uchar)local_128.m_message.pn.pi_;
  local_c8[0x11] = local_128.m_message.pn.pi_._1_1_;
  local_c8[0x12] = local_128.m_message.pn.pi_._2_1_;
  local_c8[0x13] = local_128.m_message.pn.pi_._3_1_;
  local_c8._0_8_ = local_128._0_8_;
  local_c8._8_8_ = local_128.m_message.px;
  local_80 = '\x03';
  local_128.m_message.pn.pi_ = sVar2.pi_;
  GetScriptForDestination((CScript *)local_108,(CTxDestination *)local_c8);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_c8);
  local_c8._16_8_ = 0;
  local_c8._24_8_ = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_8_ = 0;
  uVar4 = uStack_3c - 0x1d;
  cVar5.ptr = (uchar *)local_58._0_8_;
  if (uStack_3c < 0x1d) {
    cVar5.ptr = local_58;
    uVar4 = uStack_3c;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_128,cVar5,
             (const_iterator)(cVar5.ptr + (int)uVar4),(allocator_type *)&local_148);
  this_00 = CScript::operator<<((CScript *)local_c8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128)
  ;
  __first = &local_78;
  uVar4 = local_5c;
  if (0x1c < local_5c) {
    __first = local_78.indirect_contents.indirect;
    uVar4 = local_5c - 0x1d;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
             (const_iterator)__first,(uchar *)(__first + (long)(int)uVar4),
             (allocator_type *)&local_218);
  CScript::operator<<(this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
  pvVar1 = (void *)CONCAT71(local_148._M_dataplus._M_p._1_7_,local_148._M_dataplus._M_p._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_148.field_2._M_allocated_capacity - (long)pvVar1);
  }
  if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_128._0_8_,(long)local_128.m_message.pn.pi_ - local_128._0_8_);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x9c;
  file_01.m_begin = (iterator)&local_1c0;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d0,
             msg_01);
  local_148._M_dataplus._M_p._0_1_ =
       Verify((CScript *)local_c8,(CScript *)local_108,true,&local_14c);
  local_148._M_string_length = 0;
  local_148.field_2._M_allocated_capacity = 0;
  local_218._0_8_ = "Verify(scriptSig2, p2sh2, true, err)";
  local_218.m_message.px = (element_type *)0xecc2d3;
  local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
  local_128._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1d8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_110 = (string *)&local_218;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_148,(lazy_ostream *)&local_128,1,0,WARN,_cVar9,
             (size_t)&local_1e0,0x9c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_148.field_2._M_allocated_capacity);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9d;
  file_02.m_begin = (iterator)&local_1f0;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_200,
             msg_02);
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_14c == SCRIPT_ERR_OK);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ScriptErrorString_abi_cxx11_(&local_148,local_14c);
  local_128.m_message.px = (element_type *)((ulong)local_128.m_message.px & 0xffffffffffffff00);
  local_128._0_8_ = &PTR__lazy_ostream_013adf88;
  local_128.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_p2sh_tests.cpp"
  ;
  local_220 = "";
  local_110 = &local_148;
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)&local_128,1,1,WARN,_cVar9,(size_t)&local_228,0x9d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_148._M_dataplus._M_p._1_7_,local_148._M_dataplus._M_p._0_1_) !=
      &local_148.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_148._M_dataplus._M_p._1_7_,local_148._M_dataplus._M_p._0_1_),
                    local_148.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  if (0x1c < (uint)local_c8._28_4_) {
    free((void *)local_c8._0_8_);
  }
  if (0x1c < (uint)aStack_f8._12_4_) {
    free((void *)CONCAT71(local_108._1_7_,local_108[0]));
  }
  if (0x1c < uStack_cc) {
    free((void *)local_e8._0_8_);
  }
  if (0x1c < local_5c) {
    free(local_78.indirect_contents.indirect);
  }
  if (0x1c < uStack_3c) {
    free((void *)local_58._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(norecurse)
{
    ScriptError err;
    // Make sure only the outer pay-to-script-hash does the
    // extra-validation thing:
    CScript invalidAsScript;
    invalidAsScript << OP_INVALIDOPCODE << OP_INVALIDOPCODE;

    CScript p2sh = GetScriptForDestination(ScriptHash(invalidAsScript));

    CScript scriptSig;
    scriptSig << Serialize(invalidAsScript);

    // Should not verify, because it will try to execute OP_INVALIDOPCODE
    BOOST_CHECK(!Verify(scriptSig, p2sh, true, err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_BAD_OPCODE, ScriptErrorString(err));

    // Try to recur, and verification should succeed because
    // the inner HASH160 <> EQUAL should only check the hash:
    CScript p2sh2 = GetScriptForDestination(ScriptHash(p2sh));
    CScript scriptSig2;
    scriptSig2 << Serialize(invalidAsScript) << Serialize(p2sh);

    BOOST_CHECK(Verify(scriptSig2, p2sh2, true, err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
}